

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_paddsb_mips(uint64_t fs,uint64_t ft)

{
  char cVar1;
  char cVar2;
  long lVar3;
  uint8_t uVar4;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    cVar1 = vs.sb[lVar3];
    cVar2 = vt.sb[lVar3];
    uVar4 = ((char)(cVar1 + cVar2) >> 7) + 0x80;
    if (!SCARRY1(cVar1,cVar2)) {
      uVar4 = cVar1 + cVar2;
    }
    vs.ub[lVar3] = uVar4;
  }
  return vs.d;
}

Assistant:

uint64_t helper_paddsb(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 8; ++i) {
        int r = vs.sb[i] + vt.sb[i];
        vs.sb[i] = SATSB(r);
    }
    return vs.d;
}